

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

int m_split_output(aec_stream_conflict *strm)

{
  internal_state_conflict *piVar1;
  uint32_t *puVar2;
  int n;
  uint32_t uVar3;
  uint uVar4;
  aec_stream_conflict *in_RDI;
  int k;
  internal_state_conflict *state;
  
  piVar1 = in_RDI->state;
  n = piVar1->id + -1;
  do {
    uVar3 = bits_ask(in_RDI,n);
    if ((uVar3 == 0) || (in_RDI->avail_out < (ulong)piVar1->bytes_per_sample)) {
      return 0;
    }
    if (n == 0) {
      piVar1->rsip = piVar1->rsip + 1;
    }
    else {
      uVar3 = bits_get(in_RDI,n);
      puVar2 = piVar1->rsip;
      piVar1->rsip = puVar2 + 1;
      *puVar2 = uVar3 + *puVar2;
    }
    in_RDI->avail_out = in_RDI->avail_out - (ulong)piVar1->bytes_per_sample;
    bits_drop(in_RDI,n);
    uVar4 = piVar1->sample_counter + 1;
    piVar1->sample_counter = uVar4;
  } while (uVar4 < piVar1->encoded_block_size);
  piVar1->mode = m_next_cds;
  return 1;
}

Assistant:

static int m_split_output(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;
    int k = state->id - 1;

    do {
        if (bits_ask(strm, k) == 0 || strm->avail_out < state->bytes_per_sample)
            return M_EXIT;
        if (k)
            *state->rsip++ += bits_get(strm, k);
        else
            state->rsip++;
        strm->avail_out -= state->bytes_per_sample;
        bits_drop(strm, k);
    } while(++state->sample_counter < state->encoded_block_size);

    state->mode = m_next_cds;
    return M_CONTINUE;
}